

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O1

bool __thiscall SQBlob::Resize(SQBlob *this,SQInteger n)

{
  bool bVar1;
  uchar *__s;
  size_t __n;
  
  bVar1 = this->_owns;
  if ((bVar1 == true) && (this->_allocated != n)) {
    __s = (uchar *)sq_malloc(n);
    memset(__s,0,n);
    __n = this->_size;
    if (n <= this->_size) {
      __n = n;
    }
    memcpy(__s,this->_buf,__n);
    sq_free(this->_buf,this->_allocated);
    this->_buf = __s;
    this->_allocated = n;
    if (n < this->_size) {
      this->_size = n;
    }
    if (n < this->_ptr) {
      this->_ptr = n;
    }
  }
  return bVar1;
}

Assistant:

bool Resize(SQInteger n) {
        if(!_owns) return false;
        if(n != _allocated) {
            unsigned char *newbuf = (unsigned char *)sq_malloc(n);
            memset(newbuf,0,n);
            if(_size > n)
                memcpy(newbuf,_buf,n);
            else
                memcpy(newbuf,_buf,_size);
            sq_free(_buf,_allocated);
            _buf=newbuf;
            _allocated = n;
            if(_size > _allocated)
                _size = _allocated;
            if(_ptr > _allocated)
                _ptr = _allocated;
        }
        return true;
    }